

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SetActiveDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,ActiveOperationalDataset *aActiveDataset)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Error *pEVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  Error local_9a8;
  ErrorCode local_980;
  anon_class_1_0_00000001 local_97a;
  v10 local_979;
  v10 *local_978;
  size_t local_970;
  string local_968;
  allocator local_941;
  string local_940;
  ResponseHandler local_920;
  ErrorCode local_8fc;
  Error local_8f8;
  ErrorCode local_8cc;
  Error local_8c8;
  ErrorCode local_89c;
  Tlv local_898;
  Error local_878;
  ErrorCode local_850;
  allocator local_849;
  string local_848;
  Error local_828;
  anon_class_1_0_00000001 local_7fa;
  v10 local_7f9;
  v10 *local_7f8;
  size_t local_7f0;
  string local_7e8;
  Error local_7c8;
  anon_class_1_0_00000001 local_79a;
  v10 local_799;
  v10 *local_798;
  size_t local_790;
  string local_788;
  Error local_768;
  anon_class_1_0_00000001 local_73a;
  v10 local_739;
  v10 *local_738;
  size_t local_730;
  string local_728;
  Error local_708;
  anon_class_1_0_00000001 local_6da;
  v10 local_6d9;
  v10 *local_6d8;
  size_t local_6d0;
  string local_6c8;
  Error local_6a8;
  anon_class_1_0_00000001 local_67a;
  v10 local_679;
  v10 *local_678;
  size_t local_670;
  string local_668;
  Error local_648;
  anon_class_1_0_00000001 local_61a;
  v10 local_619;
  v10 *local_618;
  size_t local_610;
  string local_608;
  Error local_5e8;
  undefined1 local_5c0 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_590 [8];
  Request request;
  Error error;
  ActiveOperationalDataset *aActiveDataset_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_4b0 [16];
  v10 *local_4a0;
  ulong local_498;
  v10 *local_490;
  size_t sStack_488;
  string *local_480;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_478 [3];
  undefined1 local_460 [16];
  v10 *local_450;
  ulong local_448;
  v10 *local_440;
  size_t sStack_438;
  string *local_430;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_428 [3];
  undefined1 local_410 [16];
  v10 *local_400;
  ulong local_3f8;
  v10 *local_3f0;
  size_t sStack_3e8;
  string *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3d8 [3];
  undefined1 local_3c0 [16];
  v10 *local_3b0;
  ulong local_3a8;
  v10 *local_3a0;
  size_t sStack_398;
  string *local_390;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_388 [3];
  undefined1 local_370 [16];
  v10 *local_360;
  ulong local_358;
  v10 *local_350;
  size_t sStack_348;
  string *local_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_338 [3];
  undefined1 local_320 [16];
  v10 *local_310;
  ulong local_308;
  v10 *local_300;
  size_t sStack_2f8;
  string *local_2f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_2e8 [2];
  undefined1 local_2d8 [16];
  v10 *local_2c8;
  ulong local_2c0;
  v10 *local_2b8;
  size_t sStack_2b0;
  string *local_2a8;
  v10 *local_2a0;
  v10 **local_298;
  v10 *local_290;
  v10 **local_288;
  v10 *local_280;
  v10 **local_278;
  v10 *local_270;
  v10 **local_268;
  v10 *local_260;
  v10 **local_258;
  v10 *local_250;
  v10 **local_248;
  v10 *local_240;
  v10 **local_238;
  v10 **local_230;
  v10 *local_228;
  size_t sStack_220;
  v10 **local_210;
  v10 *local_208;
  size_t sStack_200;
  v10 **local_1f0;
  v10 *local_1e8;
  size_t sStack_1e0;
  v10 **local_1d0;
  v10 *local_1c8;
  size_t sStack_1c0;
  v10 **local_1b0;
  v10 *local_1a8;
  size_t sStack_1a0;
  v10 **local_190;
  v10 *local_188;
  size_t sStack_180;
  v10 **local_170;
  v10 *local_168;
  size_t sStack_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_158;
  undefined1 *local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_148;
  undefined8 local_140;
  undefined1 *local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  undefined8 local_118;
  undefined1 *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_108;
  undefined1 *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  CommissionerImpl **local_68;
  undefined1 *local_60;
  CommissionerImpl **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  CommissionerImpl **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&request.mEndpoint);
  coap::Message::Message((Message *)local_590,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_5c0,aHandler);
  if ((aActiveDataset->mPresentFlags & 0x8000) == 0) {
    SetActiveDataset::anon_class_1_0_00000001::operator()(&local_61a);
    local_298 = &local_618;
    local_2a0 = &local_619;
    bVar5 = ::fmt::v10::operator()(local_2a0);
    local_610 = bVar5.size_;
    local_618 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_2a8 = &local_608;
    local_2b8 = local_618;
    sStack_2b0 = local_610;
    local_230 = &local_2b8;
    local_2c8 = local_618;
    local_2c0 = local_610;
    local_228 = local_2c8;
    sStack_220 = local_2c0;
    local_2e8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_150 = local_2d8;
    local_158 = local_2e8;
    local_140 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_158;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_2c0;
    local_148 = local_158;
    local_138 = local_150;
    local_10 = local_158;
    ::fmt::v10::vformat_abi_cxx11_(&local_608,local_2c8,fmt,args);
    Error::Error(&local_5e8,kInvalidArgs,&local_608);
    Error::operator=((Error *)&request.mEndpoint,&local_5e8);
    Error::~Error(&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
  }
  else if ((aActiveDataset->mPresentFlags & 0x4000) == 0) {
    if ((aActiveDataset->mPresentFlags & 0x100) == 0) {
      if ((aActiveDataset->mPresentFlags & 0x800) == 0) {
        if ((aActiveDataset->mPresentFlags & 0x400) == 0) {
          uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
          if ((uVar2 & 1) == 0) {
            SetActiveDataset::anon_class_1_0_00000001::operator()(&local_7fa);
            local_248 = &local_7f8;
            local_250 = &local_7f9;
            bVar5 = ::fmt::v10::operator()(local_250);
            local_7f0 = bVar5.size_;
            local_7f8 = (v10 *)bVar5.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_430 = &local_7e8;
            local_440 = local_7f8;
            sStack_438 = local_7f0;
            local_190 = &local_440;
            local_450 = local_7f8;
            local_448 = local_7f0;
            local_188 = local_450;
            sStack_180 = local_448;
            local_478[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_88 = local_460;
            local_90 = local_478;
            local_78 = 0;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)local_90;
            fmt_04.size_ = 0;
            fmt_04.data_ = (char *)local_448;
            local_80 = local_90;
            local_70 = local_88;
            local_38 = local_90;
            ::fmt::v10::vformat_abi_cxx11_(&local_7e8,local_450,fmt_04,args_04);
            Error::Error(&local_7c8,kInvalidState,&local_7e8);
            Error::operator=((Error *)&request.mEndpoint,&local_7c8);
            Error::~Error(&local_7c8);
            std::__cxx11::string::~string((string *)&local_7e8);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_848,"/c/as",&local_849);
            coap::Message::SetUriPath(&local_828,(Message *)local_590,&local_848);
            pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_828);
            local_850 = kNone;
            bVar1 = commissioner::operator!=(pEVar4,&local_850);
            Error::~Error(&local_828);
            std::__cxx11::string::~string((string *)&local_848);
            std::allocator<char>::~allocator((allocator<char> *)&local_849);
            if (!bVar1) {
              iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
              tlv::Tlv::Tlv(&local_898,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
              AppendTlv(&local_878,(Message *)local_590,&local_898);
              pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_878);
              local_89c = kNone;
              bVar1 = commissioner::operator!=(pEVar4,&local_89c);
              Error::~Error(&local_878);
              tlv::Tlv::~Tlv(&local_898);
              if (!bVar1) {
                EncodeActiveOperationalDataset(&local_8c8,(Request *)local_590,aActiveDataset);
                pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_8c8);
                local_8cc = kNone;
                bVar1 = commissioner::operator!=(pEVar4,&local_8cc);
                Error::~Error(&local_8c8);
                if (!bVar1) {
                  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
                  if ((uVar2 & 1) != 0) {
                    SignRequest(&local_8f8,this,(Request *)local_590,kMeshCoP,true);
                    pEVar4 = Error::operator=((Error *)&request.mEndpoint,&local_8f8);
                    local_8fc = kNone;
                    bVar1 = commissioner::operator!=(pEVar4,&local_8fc);
                    Error::~Error(&local_8f8);
                    if (bVar1) goto LAB_001b1409;
                  }
                  std::
                  function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
                  function<ot::commissioner::CommissionerImpl::SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)::__4&,void>
                            ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                              *)&local_920,(anon_class_32_1_d0c21527 *)local_5c0);
                  ProxyClient::SendRequest
                            (&this->mProxyClient,(Request *)local_590,&local_920,0xfc00,0xf0bf);
                  std::
                  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>
                  ::~function(&local_920);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_940,"mgmt",&local_941);
                  SetActiveDataset::anon_class_1_0_00000001::operator()(&local_97a);
                  local_238 = &local_978;
                  local_240 = &local_979;
                  bVar5 = ::fmt::v10::operator()(local_240);
                  local_970 = bVar5.size_;
                  local_978 = (v10 *)bVar5.data_;
                  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                  local_480 = &local_968;
                  local_490 = local_978;
                  sStack_488 = local_970;
                  local_170 = &local_490;
                  local_4a0 = local_978;
                  local_498 = local_970;
                  local_168 = local_4a0;
                  sStack_160 = local_498;
                  this_local = (CommissionerImpl *)
                               ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                  local_60 = local_4b0;
                  local_68 = &this_local;
                  local_50 = 0;
                  args_05.field_1.values_ = in_R9.values_;
                  args_05.desc_ = (unsigned_long_long)local_68;
                  fmt_05.size_ = 0;
                  fmt_05.data_ = (char *)local_498;
                  local_58 = local_68;
                  local_48 = local_60;
                  local_40 = local_68;
                  ::fmt::v10::vformat_abi_cxx11_(&local_968,local_4a0,fmt_05,args_05);
                  Log(kDebug,&local_940,&local_968);
                  std::__cxx11::string::~string((string *)&local_968);
                  std::__cxx11::string::~string((string *)&local_940);
                  std::allocator<char>::~allocator((allocator<char> *)&local_941);
                }
              }
            }
          }
        }
        else {
          SetActiveDataset::anon_class_1_0_00000001::operator()(&local_79a);
          local_258 = &local_798;
          local_260 = &local_799;
          bVar5 = ::fmt::v10::operator()(local_260);
          local_790 = bVar5.size_;
          local_798 = (v10 *)bVar5.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_3e0 = &local_788;
          local_3f0 = local_798;
          sStack_3e8 = local_790;
          local_1b0 = &local_3f0;
          local_400 = local_798;
          local_3f8 = local_790;
          local_1a8 = local_400;
          sStack_1a0 = local_3f8;
          local_428[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_b0 = local_410;
          local_b8 = local_428;
          local_a0 = 0;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)local_b8;
          fmt_03.size_ = 0;
          fmt_03.data_ = (char *)local_3f8;
          local_a8 = local_b8;
          local_98 = local_b0;
          local_30 = local_b8;
          ::fmt::v10::vformat_abi_cxx11_(&local_788,local_400,fmt_03,args_03);
          Error::Error(&local_768,kInvalidArgs,&local_788);
          Error::operator=((Error *)&request.mEndpoint,&local_768);
          Error::~Error(&local_768);
          std::__cxx11::string::~string((string *)&local_788);
        }
      }
      else {
        SetActiveDataset::anon_class_1_0_00000001::operator()(&local_73a);
        local_268 = &local_738;
        local_270 = &local_739;
        bVar5 = ::fmt::v10::operator()(local_270);
        local_730 = bVar5.size_;
        local_738 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_390 = &local_728;
        local_3a0 = local_738;
        sStack_398 = local_730;
        local_1d0 = &local_3a0;
        local_3b0 = local_738;
        local_3a8 = local_730;
        local_1c8 = local_3b0;
        sStack_1c0 = local_3a8;
        local_3d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_d8 = local_3c0;
        local_e0 = local_3d8;
        local_c8 = 0;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)local_e0;
        fmt_02.size_ = 0;
        fmt_02.data_ = (char *)local_3a8;
        local_d0 = local_e0;
        local_c0 = local_d8;
        local_28 = local_e0;
        ::fmt::v10::vformat_abi_cxx11_(&local_728,local_3b0,fmt_02,args_02);
        Error::Error(&local_708,kInvalidArgs,&local_728);
        Error::operator=((Error *)&request.mEndpoint,&local_708);
        Error::~Error(&local_708);
        std::__cxx11::string::~string((string *)&local_728);
      }
    }
    else {
      SetActiveDataset::anon_class_1_0_00000001::operator()(&local_6da);
      local_278 = &local_6d8;
      local_280 = &local_6d9;
      bVar5 = ::fmt::v10::operator()(local_280);
      local_6d0 = bVar5.size_;
      local_6d8 = (v10 *)bVar5.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_340 = &local_6c8;
      local_350 = local_6d8;
      sStack_348 = local_6d0;
      local_1f0 = &local_350;
      local_360 = local_6d8;
      local_358 = local_6d0;
      local_1e8 = local_360;
      sStack_1e0 = local_358;
      local_388[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_100 = local_370;
      local_108 = local_388;
      local_f0 = 0;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_108;
      fmt_01.size_ = 0;
      fmt_01.data_ = (char *)local_358;
      local_f8 = local_108;
      local_e8 = local_100;
      local_20 = local_108;
      ::fmt::v10::vformat_abi_cxx11_(&local_6c8,local_360,fmt_01,args_01);
      Error::Error(&local_6a8,kInvalidArgs,&local_6c8);
      Error::operator=((Error *)&request.mEndpoint,&local_6a8);
      Error::~Error(&local_6a8);
      std::__cxx11::string::~string((string *)&local_6c8);
    }
  }
  else {
    SetActiveDataset::anon_class_1_0_00000001::operator()(&local_67a);
    local_288 = &local_678;
    local_290 = &local_679;
    bVar5 = ::fmt::v10::operator()(local_290);
    local_670 = bVar5.size_;
    local_678 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_2f0 = &local_668;
    local_300 = local_678;
    sStack_2f8 = local_670;
    local_210 = &local_300;
    local_310 = local_678;
    local_308 = local_670;
    local_208 = local_310;
    sStack_200 = local_308;
    local_338[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_128 = local_320;
    local_130 = local_338;
    local_118 = 0;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_130;
    fmt_00.size_ = 0;
    fmt_00.data_ = (char *)local_308;
    local_120 = local_130;
    local_110 = local_128;
    local_18 = local_130;
    ::fmt::v10::vformat_abi_cxx11_(&local_668,local_310,fmt_00,args_00);
    Error::Error(&local_648,kInvalidArgs,&local_668);
    Error::operator=((Error *)&request.mEndpoint,&local_648);
    Error::~Error(&local_648);
    std::__cxx11::string::~string((string *)&local_668);
  }
LAB_001b1409:
  local_980 = kNone;
  bVar1 = commissioner::operator!=((Error *)&request.mEndpoint,&local_980);
  if (bVar1) {
    Error::Error(&local_9a8,(Error *)&request.mEndpoint);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_9a8);
    Error::~Error(&local_9a8);
  }
  SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)
  ::$_4::~__4((__4 *)local_5c0);
  coap::Message::~Message((Message *)local_590);
  Error::~Error((Error *)&request.mEndpoint);
  return;
}

Assistant:

void CommissionerImpl::SetActiveDataset(ErrorHandler aHandler, const ActiveOperationalDataset &aActiveDataset)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    VerifyOrExit(aActiveDataset.mPresentFlags & ActiveOperationalDataset::kActiveTimestampBit,
                 error = ERROR_INVALID_ARGS("Active Timestamp is mandatory for an Active Operational Dataset"));

    // TLVs affect connectivity are not allowed.
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit) == 0,
                 error = ERROR_INVALID_ARGS("Channel cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit) == 0,
                 error = ERROR_INVALID_ARGS("PAN ID cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit) == 0,
                 error = ERROR_INVALID_ARGS("Mesh-Local Prefix cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));
    VerifyOrExit((aActiveDataset.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit) == 0,
                 error = ERROR_INVALID_ARGS("Network Master Key cannot be set with Active Operational Dataset, "
                                            "try setting with Pending Operational Dataset instead"));

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtActiveSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = EncodeActiveOperationalDataset(request, aActiveDataset));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_ACTIVE_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}